

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_model.cpp
# Opt level: O2

void __thiscall
DCACHE::dc_simulate_write
          (DCACHE *this,oraddr_t dataaddr,oraddr_t virt_addr,uint32_t data,int width,int data_ci)

{
  CPU *pCVar1;
  oraddr_t oVar2;
  int iVar3;
  BUS_DEVICE *pBVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  byte bVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  
  uVar5 = (ulong)dataaddr;
  pBVar4 = BUS::get_device((this->super_CACHE).bus_p,dataaddr);
  if (width == 4) {
    (*pBVar4->_vptr_BUS_DEVICE[5])(pBVar4,uVar5,(ulong)virt_addr,(ulong)data);
  }
  else if (width == 1) {
    (*pBVar4->_vptr_BUS_DEVICE[3])(pBVar4,uVar5,(ulong)virt_addr,(ulong)data & 0xff);
  }
  else if (width == 2) {
    (*pBVar4->_vptr_BUS_DEVICE[4])(pBVar4,uVar5,(ulong)virt_addr,(ulong)data & 0xffff);
  }
  pCVar1 = (this->super_CACHE).cpu;
  if ((pCVar1->sprs[1] & 2) == 0) {
    return;
  }
  if (data_ci != 0) {
    return;
  }
  if ((pCVar1->sprs[0x11] & 8) == 0) {
    return;
  }
  uVar10 = (ulong)(this->super_CACHE).nways;
  uVar7 = (this->super_CACHE).blocksize;
  uVar16 = (ulong)(this->super_CACHE).nsets;
  iVar8 = (int)((uVar5 / uVar7) % uVar16);
  uVar15 = 0xffffffffffffffff;
  for (uVar13 = 0; oVar2 = (oraddr_t)((uVar5 / uVar7) / uVar16), uVar10 != uVar13;
      uVar13 = uVar13 + 1) {
    if (this->cache_mem[uVar13].cache_set[iVar8].tagaddr == oVar2) {
      uVar15 = uVar13;
    }
    uVar15 = uVar15 & 0xffffffff;
  }
  if ((int)uVar15 < 0) {
    uVar5 = 0;
    for (uVar16 = 0; uVar10 != uVar16; uVar16 = uVar16 + 1) {
      if (this->cache_mem[uVar16].cache_set[iVar8].lru < (int)((this->super_CACHE).ustates - 1)) {
        uVar5 = uVar16 & 0xffffffff;
      }
    }
    iVar11 = (int)uVar5;
    for (uVar6 = 0; uVar6 < uVar7; uVar6 = uVar6 + 4) {
      uVar12 = (dataaddr & 0xfffffffc) + uVar6;
      pBVar4 = BUS::get_device((this->super_CACHE).bus_p,(uVar7 - 1 & uVar12) + (-uVar7 & dataaddr))
      ;
      uVar7 = (this->super_CACHE).blocksize;
      iVar3 = (*pBVar4->_vptr_BUS_DEVICE[2])
                        (pBVar4,(ulong)((uVar7 - 1 & uVar12) + (-uVar7 & dataaddr)),0);
      *(int *)((long)this->cache_mem[iVar11].cache_set[iVar8].line +
              (ulong)((this->super_CACHE).blocksize - 1 & uVar6 + dataaddr & 0xfffffffc)) = iVar3;
      uVar7 = (this->super_CACHE).blocksize;
    }
    this->cache_mem[iVar11].cache_set[iVar8].tagaddr = oVar2;
    uVar5 = (ulong)(this->super_CACHE).nways;
    lVar17 = 0;
    while (bVar18 = uVar5 != 0, uVar5 = uVar5 - 1, bVar18) {
      iVar3 = this->cache_mem[lVar17].cache_set[iVar8].lru;
      if (iVar3 != 0) {
        this->cache_mem[lVar17].cache_set[iVar8].lru = iVar3 + -1;
      }
      lVar17 = lVar17 + 1;
    }
    this->cache_mem[iVar11].cache_set[iVar8].lru = (this->super_CACHE).ustates - 1;
    return;
  }
  uVar15 = uVar15 & 0xffffffff;
  lVar17 = 0;
  while (bVar18 = uVar10 != 0, uVar10 = uVar10 - 1, bVar18) {
    iVar11 = this->cache_mem[lVar17].cache_set[iVar8].lru;
    if (this->cache_mem[uVar15].cache_set[iVar8].lru < iVar11) {
      this->cache_mem[lVar17].cache_set[iVar8].lru = iVar11 + -1;
    }
    lVar17 = lVar17 + 1;
  }
  uVar6 = uVar7 - 1 & dataaddr;
  this->cache_mem[uVar15].cache_set[iVar8].lru = (this->super_CACHE).ustates - 1;
  uVar7 = data;
  if (width != 4) {
    uVar7 = *(uint *)((long)this->cache_mem[uVar15].cache_set[iVar8].line +
                     (ulong)(uVar6 & 0xfffffffc));
    if (width == 1) {
      bVar9 = ~(byte)(dataaddr << 3) & 0x18;
      uVar14 = data & 0xff;
      uVar12 = ~(0xff << bVar9);
    }
    else {
      if (width != 2) goto LAB_00104659;
      bVar9 = (byte)(dataaddr << 3) & 0x10;
      uVar14 = data & 0xffff;
      uVar12 = 0xffff << bVar9;
      bVar9 = bVar9 ^ 0x10;
    }
    uVar7 = uVar14 << bVar9 | uVar7 & uVar12;
  }
LAB_00104659:
  this->cache_mem[uVar15].cache_set[iVar8].line[uVar6 >> 2] = uVar7;
  return;
}

Assistant:

void DCACHE::dc_simulate_write(oraddr_t dataaddr, oraddr_t virt_addr, uint32_t data, int width, int data_ci)
{
    int set, way = -1;
    int i;
    oraddr_t tagaddr;
    uint32_t tmp;
    BUS_DEVICE * device;
    device = bus_p->get_device(dataaddr);

    if (width == 4)
        device->Write32(dataaddr, virt_addr, data);
    else if (width == 2)
        device->Write16(dataaddr, virt_addr, data);
    else if (width == 1)
        device->Write8(dataaddr, virt_addr, data);

    if (!(cpu->sprs[SPR_UPR] & SPR_UPR_DCP) ||
        !(cpu->sprs[SPR_SR] & SPR_SR_DCE) || data_ci)
        return;

    /* Which set to check out? */
    set = (dataaddr / blocksize) % nsets;
    tagaddr = (dataaddr / blocksize) / nsets;

    /* Scan all ways and try to find a matching way. */
    for (i = 0; i < nways; i++)
        if (cache_mem[i].cache_set[set].tagaddr == tagaddr)
            way = i;
    
    /* Did we find our cached data? */
    if (way >= 0)
    { /* Yes, we did. */
        // dc_stats.writehit++;

        for (i = 0; i < nways; i++)
            if (cache_mem[i].cache_set[set].lru > cache_mem[way].cache_set[set].lru)
                cache_mem[i].cache_set[set].lru--;
        cache_mem[way].cache_set[set].lru = ustates - 1;
        // runtime.sim.mem_cycles += store_hitdelay;

        tmp =
            cache_mem[way].cache_set[set].line[(dataaddr & (blocksize - 1)) >> 2];
        if (width == 4)
            tmp = data;
        else if (width == 2)
        {
            tmp &= 0xffff << ((dataaddr & 2) ? 16 : 0);
            tmp |= (data & 0xffff) << ((dataaddr & 2) ? 0 : 16);
        }
        else if (width == 1)
        {
            tmp &= ~(0xff << (8 * (3 - (dataaddr & 3))));
            tmp |= (data & 0xff) << (8 * (3 - (dataaddr & 3)));
        }
        cache_mem[way].cache_set[set].line[(dataaddr & (blocksize - 1)) >> 2] =
            tmp;
    }
    else
    { /* No, we didn't. */
        int minlru = ustates - 1;
        int minway = 0;

        // dc_stats.writemiss++;

        for (i = 0; i < nways; i++)
            if (cache_mem[i].cache_set[set].lru < minlru)
                minway = i;

        for (i = 0; i < (blocksize); i += 4)
        {
            device = bus_p->get_device((dataaddr & ~(blocksize - 1)) + (((dataaddr & ~3ul) + i) & (blocksize -1)));
            cache_mem[minway].cache_set[set].line[((dataaddr + i) & (blocksize - 1)) >> 2] =
                /* FIXME: Same comment as in dc_simulate_read */
                device->Read32((dataaddr & ~(blocksize - 1)) + (((dataaddr & ~3ul) + i) & (blocksize -1)), 0);

        }

        cache_mem[minway].cache_set[set].tagaddr = tagaddr;
        for (i = 0; i < nways; i++)
            if (cache_mem[i].cache_set[set].lru)
                cache_mem[i].cache_set[set].lru--;
        cache_mem[minway].cache_set[set].lru = ustates - 1;
        // runtime.sim.mem_cycles += store_missdelay;

        // if (config.pcu.enabled)
        //     pcu_count_event(SPR_PCMR_DCM);
    }
}